

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O1

void P_ResumeConversation(void)

{
  long *plVar1;
  AActor *pc;
  AActor *npc;
  int i;
  long lVar2;
  
  plVar1 = &DAT_017e60d0;
  lVar2 = 0;
  do {
    if ((playeringame[lVar2] == true) && (plVar1[1] != 0)) {
      if ((*(byte *)(plVar1[1] + 0x20) & 0x20) == 0) {
        if (*plVar1 != 0) {
          if ((*(byte *)(*plVar1 + 0x20) & 0x20) == 0) {
            npc = (AActor *)*plVar1;
            if ((npc != (AActor *)0x0) &&
               (((npc->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              *plVar1 = 0;
              npc = (AActor *)0x0;
            }
            pc = (AActor *)plVar1[1];
            if ((pc != (AActor *)0x0) &&
               (((pc->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              plVar1[1] = 0;
              pc = (AActor *)0x0;
            }
            P_StartConversation(npc,pc,SUB81(plVar1[3],0),false);
          }
          else {
            *plVar1 = 0;
          }
        }
      }
      else {
        plVar1[1] = 0;
      }
    }
    lVar2 = lVar2 + 1;
    plVar1 = plVar1 + 0x54;
  } while (lVar2 != 8);
  return;
}

Assistant:

void P_ResumeConversation ()
{
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i])
			continue;

		player_t *p = &players[i];

		if (p->ConversationPC != NULL && p->ConversationNPC != NULL)
		{
			P_StartConversation (p->ConversationNPC, p->ConversationPC, p->ConversationFaceTalker, false);
		}
	}
}